

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_svg.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
perior::to_svg<char,std::char_traits<char>,perior::point<double,2ul>>
          (basic_ostream<char,_std::char_traits<char>_> *os,
          rectangle<perior::point<double,_2UL>_> *box,
          cubic_periodic_boundary<perior::point<double,_2UL>_> *b,string *stroke,size_t stroke_width
          ,string *fill)

{
  double dVar1;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *ppVar2;
  pointer ppVar3;
  double dVar4;
  string *psVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  size_t i;
  long lVar7;
  double *pdVar8;
  ostream *poVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  point<double,_2UL> *xy;
  bool bVar14;
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  boxes;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> bx;
  point<double,_2UL> retval_1;
  point<double,_2UL> retval;
  point<double,_2UL> lower;
  point<double,_2UL> upper;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> splitted;
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  local_f8;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> local_d8;
  double local_b8 [5];
  double dStack_90;
  string *local_88;
  basic_ostream<char,_std::char_traits<char>_> *local_80;
  size_t local_78;
  string *local_70;
  double local_68 [2];
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> local_58;
  
  local_f8.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0;
  local_f8.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0;
  local_f8.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0;
  local_78 = stroke_width;
  local_70 = stroke;
  std::
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ::reserve(&local_f8,4);
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  lVar7 = 0;
  do {
    local_b8[lVar7 + 2] = (box->center).values_.elems[lVar7] - (box->radius).values_.elems[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  lVar7 = 0;
  do {
    dVar1 = local_b8[lVar7 + 2];
    if ((b->lower_).values_.elems[lVar7] <= dVar1) {
      if ((b->upper_).values_.elems[lVar7] <= dVar1) {
        dVar1 = dVar1 - (b->width_).values_.elems[lVar7];
        goto LAB_00107a8d;
      }
    }
    else {
      dVar1 = dVar1 + (b->width_).values_.elems[lVar7];
LAB_00107a8d:
      local_b8[lVar7 + 2] = dVar1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  local_b8[4] = local_b8[2];
  dStack_90 = local_b8[3];
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  lVar7 = 0;
  do {
    local_b8[lVar7] = (box->center).values_.elems[lVar7] + (box->radius).values_.elems[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  lVar7 = 0;
  do {
    dVar1 = local_b8[lVar7];
    if ((b->lower_).values_.elems[lVar7] <= dVar1) {
      if ((b->upper_).values_.elems[lVar7] <= dVar1) {
        dVar1 = dVar1 - (b->width_).values_.elems[lVar7];
        goto LAB_00107afe;
      }
    }
    else {
      dVar1 = dVar1 + (b->width_).values_.elems[lVar7];
LAB_00107afe:
      local_b8[lVar7] = dVar1;
    }
    lVar7 = lVar7 + 1;
    if (lVar7 != 1) {
      local_68[0] = local_b8[0];
      local_68[1] = local_b8[1];
      lVar7 = 0;
      do {
        if ((b->half_width_).values_.elems[lVar7] <= (box->radius).values_.elems[lVar7]) {
          local_b8[lVar7 + 4] = (b->lower_).values_.elems[lVar7];
          local_68[lVar7] = (b->upper_).values_.elems[lVar7];
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
      local_88 = fill;
      local_80 = os;
      local_d8.first.values_.elems[0] = local_b8[4];
      local_d8.first.values_.elems[1] = dStack_90;
      local_d8.second.values_.elems[0] = local_68[0];
      dVar1 = local_d8.second.values_.elems[0];
      local_d8.second.values_.elems[1] = local_68[1];
      dVar4 = local_d8.second.values_.elems[1];
      if (local_f8.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_f8.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
        ::_M_realloc_insert<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>
                  ((vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
                    *)&local_f8,
                   (iterator)
                   local_f8.
                   super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_d8);
      }
      else {
        ((local_f8.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->first).values_.elems[0] = local_b8[4];
        ((local_f8.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->first).values_.elems[1] = dStack_90;
        local_d8.second.values_.elems[0]._0_4_ = SUB84(local_68[0],0);
        local_d8.second.values_.elems[0]._4_4_ = (undefined4)((ulong)local_68[0] >> 0x20);
        local_d8.second.values_.elems[1]._0_4_ = SUB84(local_68[1],0);
        local_d8.second.values_.elems[1]._4_4_ = (undefined4)((ulong)local_68[1] >> 0x20);
        *(undefined4 *)
         ((local_f8.
           super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems =
             local_d8.second.values_.elems[0]._0_4_;
        *(undefined4 *)
         ((long)((local_f8.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems + 4) =
             local_d8.second.values_.elems[0]._4_4_;
        *(undefined4 *)
         (((local_f8.
            super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems + 1) =
             local_d8.second.values_.elems[1]._0_4_;
        *(undefined4 *)
         ((long)((local_f8.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems + 0xc) =
             local_d8.second.values_.elems[1]._4_4_;
        local_f8.
        super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_f8.
             super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        local_d8.second.values_.elems[0] = dVar1;
        local_d8.second.values_.elems[1] = dVar4;
      }
      lVar7 = 0;
      do {
        if ((long)local_f8.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_f8.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar12 = (long)local_f8.
                         super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_f8.
                         super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          lVar11 = 0x10;
          uVar13 = 0;
          do {
            if ((ulong)((long)local_f8.
                              super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_f8.
                              super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar13) {
              uVar10 = std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,uVar13);
              if (local_f8.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0) {
                operator_delete(local_f8.
                                super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              _Unwind_Resume(uVar10);
            }
            pdVar8 = (double *)
                     ((long)(&(local_f8.
                               super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + -1) + lVar11);
            local_d8.first.values_.elems[0] = *pdVar8;
            local_d8.first.values_.elems[1] = pdVar8[1];
            pdVar8 = (double *)
                     ((long)((local_f8.
                              super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first).values_.elems +
                     lVar11);
            local_d8.second.values_.elems[0] = *pdVar8;
            local_d8.second.values_.elems[1] = pdVar8[1];
            dVar1 = local_d8.first.values_.elems[lVar7];
            pdVar8 = local_d8.second.values_.elems + lVar7;
            if (*pdVar8 <= dVar1 && dVar1 != *pdVar8) {
              pdVar8 = (double *)
                       ((long)((local_f8.
                                super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first).values_.elems +
                       lVar11);
              local_58.first.values_.elems[0] = local_d8.first.values_.elems[0];
              local_58.first.values_.elems[1] = local_d8.first.values_.elems[1];
              local_58.second.values_.elems[0] = local_d8.second.values_.elems[0];
              local_58.second.values_.elems[1] = local_d8.second.values_.elems[1];
              local_d8.first.values_.elems[lVar7] = (b->lower_).values_.elems[lVar7];
              local_58.second.values_.elems[lVar7] = (b->upper_).values_.elems[lVar7];
              *(double *)
               ((long)(&(local_f8.
                         super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + -1) + lVar11) =
                   local_d8.first.values_.elems[0];
              *(double *)
               ((long)((local_f8.
                        super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first).values_.elems +
               lVar11 + -8) = local_d8.first.values_.elems[1];
              *pdVar8 = local_d8.second.values_.elems[0];
              pdVar8[1] = local_d8.second.values_.elems[1];
              if (local_f8.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_f8.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
                ::
                _M_realloc_insert<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>const&>
                          ((vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
                            *)&local_f8,
                           (iterator)
                           local_f8.
                           super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_58);
              }
              else {
                ((local_f8.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first).values_.elems[0] =
                     local_58.first.values_.elems[0];
                ((local_f8.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first).values_.elems[1] =
                     local_58.first.values_.elems[1];
                *(undefined4 *)
                 ((local_f8.
                   super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems =
                     local_58.second.values_.elems[0]._0_4_;
                *(undefined4 *)
                 ((long)((local_f8.
                          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems + 4) =
                     local_58.second.values_.elems[0]._4_4_;
                *(undefined4 *)
                 (((local_f8.
                    super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems + 1) =
                     local_58.second.values_.elems[1]._0_4_;
                *(undefined4 *)
                 ((long)((local_f8.
                          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems + 0xc)
                     = local_58.second.values_.elems[1]._4_4_;
                local_f8.
                super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_f8.
                     super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar13 = uVar13 + 1;
            lVar11 = lVar11 + 0x20;
          } while (lVar12 + (ulong)(lVar12 == 0) != uVar13);
        }
        pbVar6 = local_80;
        psVar5 = local_88;
        ppVar3 = local_f8.
                 super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar14 = lVar7 == 0;
        lVar7 = lVar7 + 1;
        ppVar2 = local_f8.
                 super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (bVar14);
      for (; ppVar2 != ppVar3; ppVar2 = ppVar2 + 1) {
        local_d8.first.values_.elems[0] = 0.0;
        local_d8.first.values_.elems[1] = 0.0;
        lVar7 = 0;
        do {
          local_d8.first.values_.elems[lVar7] =
               (ppVar2->second).values_.elems[lVar7] - (ppVar2->first).values_.elems[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 == 1);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar6,"<rect x = \"",0xb);
        poVar9 = std::ostream::_M_insert<double>((ppVar2->first).values_.elems[0]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" y = \"",7);
        poVar9 = std::ostream::_M_insert<double>((ppVar2->first).values_.elems[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" width = \"",0xb);
        poVar9 = std::ostream::_M_insert<double>(local_d8.first.values_.elems[0]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" height = \"",0xc);
        poVar9 = std::ostream::_M_insert<double>(local_d8.first.values_.elems[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" stroke = \"",0xc);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(local_70->_M_dataplus)._M_p,local_70->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" stroke-width = \"",0x12);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" fill = \"",10);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"/>\n",4);
      }
      if (local_f8.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0) {
        operator_delete(local_f8.
                        super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return pbVar6;
    }
  } while( true );
}

Assistant:

std::basic_ostream<charT, traits>&
to_svg(std::basic_ostream<charT, traits>&     os,
       const rectangle<pointT>&               box,
       const cubic_periodic_boundary<pointT>& b,
       const std::string&                     stroke       = "black",
       const std::size_t                      stroke_width = 1,
       const std::string&                     fill         = "none")
{
    BOOST_STATIC_ASSERT_MSG(
            ::perior::traits::dimension<pointT>::value == 2,
            "to_svg works only with 2-dimensional rectangle");

    // split box according to the boundary
    // here, use box
    std::vector<std::pair<pointT, pointT> > boxes; boxes.reserve(4);
    pointT lower = restrict_position(box.center - box.radius, b);
    pointT upper = restrict_position(box.center + box.radius, b);
    for(std::size_t i=0; i<2; ++i)
    {
        if(box.radius[i] >= b.half_width()[i])
        {
            lower[i] = b.lower()[i];
            upper[i] = b.upper()[i];
        }
    }

    boxes.push_back(std::make_pair(lower, upper));

    for(std::size_t dim=0; dim < 2; ++dim)
    {
        const std::size_t sz = boxes.size();
        for(std::size_t i=0; i<sz; ++i)
        {
            std::pair<pointT, pointT> bx = boxes.at(i);
            if(bx.first[dim] > bx.second[dim])
            {
                std::pair<pointT, pointT> splitted(bx);
                bx.first[dim]        = b.lower()[dim];
                splitted.second[dim] = b.upper()[dim];
                boxes.at(i) = bx;
                boxes.push_back(splitted);
            }
        }
    }

    for(typename std::vector<std::pair<pointT, pointT> >::const_iterator
            i(boxes.begin()), e(boxes.end()); i != e; ++i)
    {
        const pointT& xy = i->first;
        const pointT  rg = i->second - i->first;
        os << "<rect x = \""   << xy[0]  << "\" y = \""      << xy[1]
           << "\" width = \""  << rg[0]  << "\" height = \"" << rg[1]
           << "\" stroke = \"" << stroke << "\" stroke-width = \"" << stroke_width
           << "\" fill = \""   << fill   << "\"/>\n";
    }
    return os;
}